

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  time_t tVar9;
  fnode_service_t *svc;
  size_t sVar10;
  char *__ptr;
  long lVar11;
  char data [256];
  
  tVar9 = time((time_t *)0x0);
  srand((uint)tVar9);
  if (argc < 2) {
    __ptr = "Usage: test-cocl SERIAL-NUMBER\n";
    sVar10 = 0x1f;
  }
  else {
    svc = fnode_service_create(argv[1],"COCL");
    if (svc != (fnode_service_t *)0x0) {
      fnode_service_reg_handler(svc,handler);
      lVar11 = 0;
      do {
        do {
          fnode_service_update(svc);
          tVar9 = time((time_t *)0x0);
        } while (tVar9 - lVar11 < 0xb);
        iVar1 = rand();
        iVar2 = rand();
        iVar3 = rand();
        iVar4 = rand();
        iVar5 = rand();
        iVar6 = rand();
        iVar7 = rand();
        iVar8 = rand();
        snprintf(data,0x100,"%d%d%d%d%d%d%d%d%d",0,(ulong)(uint)(iVar1 % 2),(ulong)(uint)(iVar2 % 2)
                 ,(long)iVar3 % 2 & 0xffffffff,(long)iVar4 % 2 & 0xffffffff,
                 (long)iVar5 % 2 & 0xffffffff,(long)iVar6 % 2 & 0xffffffff,
                 (long)iVar7 % 2 & 0xffffffff,(long)iVar8 % 2 & 0xffffffff);
        sVar10 = strlen(data);
        fnode_service_notify_state(svc,data,(uint32_t)sVar10);
        lVar11 = tVar9;
      } while( true );
    }
    __ptr = "Failed to create COCL service\n";
    sVar10 = 0x1e;
  }
  fwrite(__ptr,sVar10,1,_stderr);
  return -1;
}

Assistant:

int main(int argc, char ** argv)
{
    srand(time(0));

    if (argc < 2)
    {
        fprintf(stderr, "Usage: test-cocl SERIAL-NUMBER\n");
        return -1;
    }

    fnode_service_t * service = fnode_service_create(argv[1], "COCL");
    if ( !service )
    {
        fprintf(stderr, "Failed to create COCL service\n");
        return -1;
    }

    fnode_service_reg_handler(service, handler);

    time_t last_time = 0;

    for(;;)
    {
        fnode_service_update(service);

        time_t time_now = time(0);
        if (time_now - last_time > 10)
        {
            char data[256];
            snprintf(data, sizeof data, "%d%d%d%d%d%d%d%d%d",
                    0,
                    rand() % 2, rand() % 2, rand() % 2, rand() % 2, rand() % 2, rand() % 2, rand() % 2, rand() % 2);
            fnode_service_notify_state(service, data, strlen(data));
            last_time = time_now;
        }
    }

    fnode_service_release(service);
    return 0;
}